

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  IResultCapture *pIVar3;
  string local_4e8;
  string local_4c8;
  undefined1 local_4a8 [40];
  _Alloc_hider local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  OfType local_460;
  undefined2 local_45c;
  SectionInfo testCaseSection;
  Counts assertions;
  undefined1 local_3e8 [376];
  SectionStats testCaseSectionStats;
  AssertionResult result;
  Totals deltaTotals;
  TestCaseInfo testInfo;
  
  local_4a8._8_8_ = local_4a8 + 0x18;
  local_4a8._0_8_ = (DecomposedExpression *)0x0;
  local_4a8._16_8_ = 0;
  local_4a8[0x18] = '\0';
  local_480._M_p = (pointer)&local_470;
  local_478 = 0;
  local_470._M_local_buf[0] = '\0';
  local_45c._0_1_ = false;
  local_45c._1_1_ = false;
  local_460 = FatalErrorCondition;
  std::__cxx11::string::_M_assign((string *)&local_480);
  AssertionResult::AssertionResult
            (&result,&this->m_lastAssertionInfo,(AssertionResultData *)local_4a8);
  pIVar3 = getResultCapture();
  (*pIVar3->_vptr_IResultCapture[2])(pIVar3,&result);
  handleUnfinishedSections(this);
  _name = this->m_activeTestCase;
  SectionInfo::SectionInfo
            (&testCaseSection,&(_name->super_TestCaseInfo).lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  assertions.passed = 0;
  assertions.failedButOk = 0;
  assertions.failed = 1;
  SectionStats::SectionStats(&testCaseSectionStats,&testCaseSection,&assertions,0.0,false);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&testCaseSectionStats);
  TestCaseInfo::TestCaseInfo(&testInfo,&this->m_activeTestCase->super_TestCaseInfo);
  deltaTotals.testCases.failedButOk = 0;
  deltaTotals.assertions.failedButOk = 0;
  deltaTotals.testCases.passed = 0;
  deltaTotals.assertions.passed = 0;
  deltaTotals.assertions.failed = 0;
  deltaTotals.testCases.failed = 1;
  pIVar2 = (this->m_reporter).m_p;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8._M_string_length = 0;
  local_4c8.field_2._M_local_buf[0] = '\0';
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_local_buf[0] = '\0';
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_3e8,&testInfo,&deltaTotals,&local_4c8,&local_4e8,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,local_3e8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_3e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_3e8._0_8_ = local_3e8 + 0x10;
  local_3e8._8_8_ = (pointer)0x0;
  local_3e8[0x10] = '\0';
  testGroupEnded(this,(string *)local_3e8,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)local_3e8);
  pIVar2 = (this->m_reporter).m_p;
  TestRunStats::TestRunStats((TestRunStats *)local_3e8,&this->m_runInfo,&this->m_totals,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2,local_3e8);
  TestRunStats::~TestRunStats((TestRunStats *)local_3e8);
  TestCaseInfo::~TestCaseInfo(&testInfo);
  SectionStats::~SectionStats(&testCaseSectionStats);
  SectionInfo::~SectionInfo(&testCaseSection);
  AssertionResult::~AssertionResult(&result);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_4a8);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            // Don't rebuild the result -- the stringification itself can cause more fatal errors
            // Instead, fake a result data.
            AssertionResultData tempResult;
            tempResult.resultType = ResultWas::FatalErrorCondition;
            tempResult.message = message;
            AssertionResult result(m_lastAssertionInfo, tempResult);

            getResultCapture().assertionEnded(result);

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        std::string(),
                                                        std::string(),
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( std::string(), m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }